

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int toAscii(ENCODING *enc,char *ptr,char *end)

{
  char *local_38;
  char *p;
  char *pcStack_28;
  char buf [1];
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  local_38 = (char *)((long)&p + 7);
  pcStack_28 = end;
  end_local = ptr;
  ptr_local = (char *)enc;
  (*enc->utf8Convert)(enc,&end_local,end,&local_38,(char *)&stack0xffffffffffffffd8);
  if (local_38 == (char *)((long)&p + 7)) {
    enc_local._4_4_ = -1;
  }
  else {
    enc_local._4_4_ = (int)p._7_1_;
  }
  return enc_local._4_4_;
}

Assistant:

static int
toAscii(const ENCODING *enc, const char *ptr, const char *end) {
  char buf[1];
  char *p = buf;
  XmlUtf8Convert(enc, &ptr, end, &p, p + 1);
  if (p == buf)
    return -1;
  else
    return buf[0];
}